

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O1

p_ply_element ply_grow_element(p_ply ply)

{
  p_ply_element ptVar1;
  
  if (ply->element == (p_ply_element)0x0) {
    if (ply->nelements != 0) {
      __assert_fail("ply->element || ply->nelements == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                    ,0x496,"p_ply_element ply_grow_element(p_ply)");
    }
  }
  else if (ply->nelements < 1) {
    __assert_fail("!ply->element || ply->nelements > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x497,"p_ply_element ply_grow_element(p_ply)");
  }
  ptVar1 = (p_ply_element)ply_grow_array(ply,&ply->element,&ply->nelements,0x118);
  if (ptVar1 == (p_ply_element)0x0) {
    ptVar1 = (p_ply_element)0x0;
  }
  else {
    ptVar1->name[0] = '\0';
    ptVar1->ninstances = 0;
    ptVar1->property = (p_ply_property)0x0;
    ptVar1->nproperties = 0;
  }
  return ptVar1;
}

Assistant:

static p_ply_element ply_grow_element(p_ply ply) {
    p_ply_element element = NULL;
    assert(ply);
    assert(ply->element || ply->nelements == 0);
    assert(!ply->element || ply->nelements > 0);
    element = (p_ply_element) ply_grow_array(ply, (void **) &ply->element,
            &ply->nelements, sizeof(t_ply_element));
    if (!element) return NULL;
    ply_element_init(element);
    return element;
}